

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Cpu.cpp
# Opt level: O2

void __thiscall Ay_Cpu::reset(Ay_Cpu *this,void *m)

{
  this->mem = (uint8_t *)m;
  this->state = &this->state_;
  this->end_time_ = 0;
  (this->state_).base = 0;
  (this->state_).time = 0;
  (this->r).pc = 0;
  (this->r).sp = 0;
  (this->r).ix = 0;
  (this->r).iy = 0;
  (this->r).field_4 = (anon_union_8_2_94730036_for_registers_t_4)0x0;
  (this->r).alt = (anon_union_8_2_94730036_for_alt)0x0;
  *(undefined8 *)((long)&(this->r).alt + 6) = 0;
  return;
}

Assistant:

void Ay_Cpu::reset( void* m )
{
	mem = (uint8_t*) m;
	
	check( state == &state_ );
	state = &state_;
	state_.time = 0;
	state_.base = 0;
	end_time_   = 0;
	
	memset( &r, 0, sizeof r );
}